

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item_Array::remove(Fl_Tree_Item_Array *this,char *__filename)

{
  Fl_Tree_Item *this_00;
  int extraout_EAX;
  int iVar1;
  int extraout_EAX_00;
  int index;
  int local_18;
  int i;
  int index_local;
  Fl_Tree_Item_Array *this_local;
  
  index = (int)__filename;
  if ((this->_items[index] != (Fl_Tree_Item *)0x0) &&
     (this_00 = this->_items[index], this_00 != (Fl_Tree_Item *)0x0)) {
    Fl_Tree_Item::~Fl_Tree_Item(this_00);
    operator_delete(this_00,0x88);
  }
  this->_items[index] = (Fl_Tree_Item *)0x0;
  this->_total = this->_total + -1;
  for (local_18 = index; local_18 < this->_total; local_18 = local_18 + 1) {
    this->_items[local_18] = this->_items[local_18 + 1];
  }
  if (index < this->_total) {
    Fl_Tree_Item::update_prev_next(this->_items[index],index);
    iVar1 = extraout_EAX;
  }
  else {
    iVar1 = index + -1;
    if ((-1 < iVar1) && (iVar1 = index + -1, iVar1 < this->_total)) {
      Fl_Tree_Item::update_prev_next(this->_items[index + -1],index + -1);
      iVar1 = extraout_EAX_00;
    }
  }
  return iVar1;
}

Assistant:

void Fl_Tree_Item_Array::remove(int index) {
  if ( _items[index] ) {			// delete if non-zero
#if FLTK_ABI_VERSION >= 10303
    if ( _flags & MANAGE_ITEM )
#endif
      delete _items[index];
  }
  _items[index] = 0;
  _total--;
  for ( int i=index; i<_total; i++ ) {		// reshuffle the array
    _items[i] = _items[i+1];
  }
#if FLTK_ABI_VERSION >= 10303
  if ( _flags & MANAGE_ITEM ) 
#endif
  {
    if ( index < _total ) {			// removed item not last?
      _items[index]->update_prev_next(index);	// update next item's prev/next and neighbors
    } else if ( ((index-1) >= 0) &&		// removed item IS last?
	      ((index-1) < _total)) {
      _items[index-1]->update_prev_next(index-1);// update prev item's prev/next and neighbors
    }
  }
}